

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O0

string * rtf_format_abi_cxx11_(string *__return_storage_ptr__,char *fmt,va_list *args)

{
  size_type __n;
  reference pvVar1;
  allocator<char> local_6e;
  undefined1 local_6d;
  allocator_type local_59;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> str;
  int len;
  int chars_written;
  va_list newargs;
  va_list *args_local;
  char *fmt_local;
  string *formatted;
  
  newargs[0].overflow_arg_area = (*args)[0].reg_save_area;
  len = args[0][0].gp_offset;
  unique0x10000138 = args[0][0].fp_offset;
  newargs[0]._0_8_ = (*args)[0].overflow_arg_area;
  newargs[0].reg_save_area = args;
  str.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       vsnprintf((char *)0x0,0,fmt,&len);
  str.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
       str.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
  __n = (size_type)(int)str.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_58,__n,&local_59);
  std::allocator<char>::~allocator(&local_59);
  newargs[0].overflow_arg_area = *(void **)((long)newargs[0].reg_save_area + 0x10);
  _len = *newargs[0].reg_save_area;
  newargs[0]._0_8_ = *(undefined8 *)((long)newargs[0].reg_save_area + 8);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_58,0);
  vsnprintf(pvVar1,(long)(int)str.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,fmt
            ,&len);
  local_6d = 0;
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_58,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pvVar1,&local_6e);
  std::allocator<char>::~allocator(&local_6e);
  local_6d = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

string rtf_format(const char* fmt, va_list& args)
{
    va_list newargs;
    va_copy(newargs, args);
    const int chars_written = vsnprintf(nullptr, 0, fmt, newargs);
    const int len = chars_written + 1;

    vector<char> str(len);

    va_end(newargs);

    va_copy(newargs, args);

    vsnprintf(&str[0], len, fmt, newargs);

    va_end(newargs);

    string formatted(&str[0]);

    return formatted;
}